

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# IceMatrix4x4.cpp
# Opt level: O3

float __thiscall IceMaths::Matrix4x4::CoFactor(Matrix4x4 *this,udword row,udword col)

{
  float fVar1;
  float fVar2;
  float fVar3;
  float fVar4;
  float fVar5;
  float fVar6;
  float fVar7;
  float fVar8;
  ulong uVar9;
  uint uVar10;
  uint uVar11;
  ulong uVar12;
  uint uVar13;
  ulong uVar14;
  float fVar15;
  
  uVar10 = (row + 1 & 3) << 4;
  uVar9 = (ulong)((col + 1 & 3) << 2);
  uVar11 = (row & 3 ^ 2) << 4;
  uVar12 = (ulong)((col & 3 ^ 2) << 2);
  uVar13 = (row - 1 & 3) << 4;
  uVar14 = (ulong)((col - 1 & 3) << 2);
  fVar15 = *(float *)((long)this->m[0] + uVar12 + uVar11);
  fVar1 = *(float *)((long)this->m[0] + uVar9 + uVar10);
  fVar2 = *(float *)((long)this->m[0] + uVar9 + uVar13);
  fVar3 = *(float *)((long)this->m[0] + uVar14 + uVar11);
  fVar4 = *(float *)((long)this->m[0] + uVar12 + uVar10);
  fVar5 = *(float *)((long)this->m[0] + uVar12 + uVar13);
  fVar6 = *(float *)((long)this->m[0] + uVar14 + uVar13);
  fVar7 = *(float *)((long)this->m[0] + uVar14 + uVar10);
  fVar8 = *(float *)((long)this->m[0] + uVar9 + uVar11);
  fVar15 = (fVar8 * fVar7 * fVar5 + fVar1 * fVar15 * fVar6 + fVar2 * fVar3 * fVar4) -
           (fVar8 * fVar6 * fVar4 + fVar2 * fVar15 * fVar7 + fVar1 * fVar3 * fVar5);
  if ((col + row & 1) != 0) {
    fVar15 = -fVar15;
  }
  return fVar15;
}

Assistant:

float Matrix4x4::CoFactor(udword row, udword col) const
{
	return	 (( m[(row+1)&3][(col+1)&3]*m[(row+2)&3][(col+2)&3]*m[(row+3)&3][(col+3)&3] +
				m[(row+1)&3][(col+2)&3]*m[(row+2)&3][(col+3)&3]*m[(row+3)&3][(col+1)&3] +
				m[(row+1)&3][(col+3)&3]*m[(row+2)&3][(col+1)&3]*m[(row+3)&3][(col+2)&3])
			-  (m[(row+3)&3][(col+1)&3]*m[(row+2)&3][(col+2)&3]*m[(row+1)&3][(col+3)&3] +
				m[(row+3)&3][(col+2)&3]*m[(row+2)&3][(col+3)&3]*m[(row+1)&3][(col+1)&3] +
				m[(row+3)&3][(col+3)&3]*m[(row+2)&3][(col+1)&3]*m[(row+1)&3][(col+2)&3])) * ((row + col) & 1 ? -1.0f : +1.0f);
}